

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall
wabt::DataScriptModule<(wabt::ScriptModuleType)1>::~DataScriptModule
          (DataScriptModule<(wabt::ScriptModuleType)1> *this)

{
  pointer puVar1;
  pointer pcVar2;
  
  (this->super_ScriptModuleMixin<(wabt::ScriptModuleType)1>).super_ScriptModule._vptr_ScriptModule =
       (_func_int **)&PTR__DataScriptModule_0155e068;
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name).field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

const Location& location() const override { return loc; }